

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O2

void __thiscall
Lodtalk::MethodDictionary::internalAtPut
          (MethodDictionary *this,VMContext *context,Oop key,Oop value)

{
  Oop OVar1;
  ptrdiff_t pVar2;
  Oop *pOVar3;
  Oop *pOVar4;
  OopRef valueRef;
  OopRef keyRef;
  anon_union_8_4_0eb573b0_for_Oop_0 local_70;
  VMContext *local_68;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  VMContext *local_48;
  
  pVar2 = HashedCollection::
          findKeyPosition<Lodtalk::Oop(Lodtalk::Oop_const&),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                    ((HashedCollection *)this,key,identityFunction<Lodtalk::Oop>,identityHashOf,
                     identityOopEquals);
  if (pVar2 < 0) {
    local_50 = key.field_0;
    local_48 = context;
    OopRef::registerSelf((OopRef *)&local_50);
    local_70 = value.field_0;
    local_68 = context;
    OopRef::registerSelf((OopRef *)&local_70);
    increaseCapacity(this,context);
    internalAtPut(this,context,(Oop)local_50,(Oop)local_70);
    OopRef::~OopRef((OopRef *)&local_70);
    OopRef::~OopRef((OopRef *)&local_50);
  }
  else {
    pOVar3 = getHashTableKeys(this);
    pOVar4 = getHashTableValues(this);
    OVar1.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pOVar3[pVar2].field_0.pointer;
    pOVar3[pVar2].field_0 = key.field_0;
    pOVar4[pVar2].field_0 = value.field_0;
    if (OVar1.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
      increaseSize(this,context);
      return;
    }
  }
  return;
}

Assistant:

void internalAtPut(VMContext *context, Oop key, Oop value)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
		{
            OopRef keyRef(context, key);
            OopRef valueRef(context, value);
			increaseCapacity(context);
            return internalAtPut(context, keyRef.oop, valueRef.oop);
		}

		// Put the key and value.
		auto keyArray = getHashTableKeys();
		auto valueArray = getHashTableValues();
		auto oldKey = keyArray[position];
		keyArray[position] = key;
		valueArray[position] = value;

		// Increase the size.
		if(isNil(oldKey))
			increaseSize(context);
	}